

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::reportTestResult(TestSuite *this,string *test_name,int result)

{
  byte bVar1;
  string *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  int in_EDX;
  byte *in_RDI;
  string res_msg;
  char msg_buf [1024];
  string time_str;
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  cur_time;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffb50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffb58;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffb60;
  string local_478 [32];
  char local_458 [464];
  uint64_t in_stack_fffffffffffffd78;
  string local_50 [32];
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28;
  undefined8 local_20;
  int local_14;
  
  local_14 = in_EDX;
  local_20 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->__d);
  std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_28);
  usToString_abi_cxx11_(in_stack_fffffffffffffd78);
  psVar2 = getResMsg_abi_cxx11_();
  std::__cxx11::string::string(local_478,(string *)psVar2);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  bVar1 = std::__cxx11::string::empty();
  pcVar5 = ": ";
  if ((bVar1 & 1) != 0) {
    pcVar5 = "";
  }
  uVar6 = std::__cxx11::string::c_str();
  sprintf(local_458,"%s (\x1b[33m%s\x1b[0m)%s%s",uVar3,uVar4,pcVar5,uVar6);
  if (local_14 < 0) {
    printf("[ \x1b[31mFAIL\x1b[0m ] %s\n",local_458);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  }
  else {
    if ((((*in_RDI & 1) == 0) && ((in_RDI[0x3c] & 1) == 0)) || ((in_RDI[0x3b] & 1) != 0)) {
      printf("\x1b[1A");
      printf("\r");
    }
    else {
      printf("\x1b[1;30m   === TEST MESSAGE (END) ===\n\x1b[0m");
    }
    printf("[ \x1b[32mPASS\x1b[0m ] %s\n",local_458);
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  }
  if ((local_14 != 0) && (((in_RDI[1] & 1) != 0 || ((in_RDI[0x3a] & 1) != 0)))) {
    abort();
  }
  getTestName_abi_cxx11_();
  std::__cxx11::string::clear();
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void reportTestResult(const std::string& test_name,
                          int result)
    {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeLocal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        char msg_buf[1024];
        std::string res_msg = TestSuite::getResMsg();
        sprintf(msg_buf, "%s (" _CL_BROWN("%s") ")%s%s",
                test_name.c_str(),
                time_str.c_str(),
                (res_msg.empty() ? "" : ": "),
                res_msg.c_str() );

        if (result < 0) {
            printf("[ " _CL_RED("FAIL") " ] %s\n", msg_buf);
            cntFail++;
        } else {
            if ( (options.printTestMessage || displayMsg) &&
                 !suppressMsg ) {
                printf(_CL_D_GRAY("   === TEST MESSAGE (END) ===\n"));
            } else {
                // Move a line up.
                printf("\033[1A");
                // Clear current line.
                printf("\r");
                // And then overwrite.
            }
            printf("[ " _CL_GREEN("PASS") " ] %s\n", msg_buf);
            cntPass++;
        }

        if ( result != 0 &&
             (options.abortOnFailure || forceAbortOnFailure) ) {
            abort();
        }
        getTestName().clear();
    }